

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O3

void __thiscall GenCADFile::fill_signals_cache(GenCADFile *this)

{
  GenCADFile *pGVar1;
  int lb;
  int lb_00;
  GenCADFile *ast;
  mpc_ast_t *parent;
  char *__s;
  mapped_type *pmVar2;
  GenCADFile *pGVar3;
  char *node_pin_name;
  char *node_comp_name;
  ComponentPin key;
  char *local_a0;
  char *local_98;
  GenCADFile *local_90;
  map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_88;
  GenCADFile *local_80;
  char *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_40 [2];
  
  lb = mpc_ast_get_index_lb(this->signals_ast,"signal|>",0);
  if (-1 < lb) {
    local_88 = &this->m_signals_cache;
    local_90 = this;
    do {
      ast = (GenCADFile *)mpc_ast_get_child_lb(this->signals_ast,"signal|>",lb);
      lb_00 = mpc_ast_get_index_lb((mpc_ast_t *)ast,"node|>",0);
      pGVar1 = ast;
      this = local_90;
      pGVar3 = local_80;
      while (local_80 = pGVar1, local_90 = this, -1 < lb_00) {
        pGVar3 = ast;
        parent = mpc_ast_get_child_lb((mpc_ast_t *)ast,"node|>",lb_00);
        local_98 = get_nonquoted_or_quoted_string_child(pGVar3,parent,"component_name");
        local_a0 = get_nonquoted_or_quoted_string_child(pGVar3,parent,"pin_name");
        __s = get_stringtoend_child(pGVar3,(mpc_ast_t *)ast,"sig_name_to_end");
        if (((__s != (char *)0x0) && (local_98 != (char *)0x0)) && (local_a0 != (char *)0x0)) {
          std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
          _Tuple_impl<char*&,char*&,void>
                    ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)local_70,
                     &local_98,&local_a0);
          pmVar2 = std::
                   map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_88,(key_type *)local_70);
          local_78 = (char *)pmVar2->_M_string_length;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)pmVar2,0,local_78,(ulong)__s);
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          ast = local_80;
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
        }
        lb_00 = mpc_ast_get_index_lb((mpc_ast_t *)ast,"node|>",lb_00 + 1);
        pGVar1 = local_80;
        this = local_90;
        pGVar3 = local_80;
      }
      local_80 = pGVar3;
      lb = mpc_ast_get_index_lb(this->signals_ast,"signal|>",lb + 1);
    } while (-1 < lb);
  }
  return;
}

Assistant:

void GenCADFile::fill_signals_cache() {
	for (int i = 0;;) {
		i = mpc_ast_get_index_lb(signals_ast, "signal|>", i);
		if (i < 0) break;
		mpc_ast_t *signal_ast = mpc_ast_get_child_lb(signals_ast, "signal|>", i);
		for (int j = 0;;) {
			j = mpc_ast_get_index_lb(signal_ast, "node|>", j);
			if (j < 0) break;
			mpc_ast_t *node_ast           = mpc_ast_get_child_lb(signal_ast, "node|>", j);
			char *node_comp_name = get_nonquoted_or_quoted_string_child(node_ast, "component_name");
			char *node_pin_name = get_nonquoted_or_quoted_string_child(node_ast, "pin_name");
			char *signal_name = get_stringtoend_child(signal_ast, "sig_name_to_end");
			if (node_comp_name && node_pin_name && signal_name) {
				ComponentPin key{node_comp_name, node_pin_name};
				m_signals_cache[key] = signal_name;
			}
			j++;
		}
		i++;
	}
}